

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_writemap.cpp
# Opt level: O0

void Cmd_dumpmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  undefined4 local_108;
  undefined4 local_104;
  wadlump_t lumps [12];
  undefined8 local_3c;
  wadinfo_t header;
  FILE *file;
  char *mapname;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Usage: dumpmap <wadname> [mapname]\n");
  }
  else if (gamestate == GS_LEVEL) {
    iVar1 = FCommandLine::argc(argv);
    if (iVar1 < 3) {
      if ((gameinfo.flags & 1U) == 0) {
        file = (FILE *)anon_var_dwarf_316b25;
      }
      else {
        file = (FILE *)anon_var_dwarf_316ab9;
      }
    }
    else {
      file = (FILE *)FCommandLine::operator[](argv,2);
    }
    pcVar2 = FCommandLine::operator[](argv,1);
    header._4_8_ = fopen(pcVar2,"wb");
    if ((FILE *)header._4_8_ == (FILE *)0x0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("Cannot write %s\n",pcVar2);
    }
    else {
      local_3c = 0xc44415750;
      header.Magic = 0;
      memset(&local_108,0,0xc0);
      fseek((FILE *)header._4_8_,0xc,0);
      local_108 = 0xc;
      local_104 = 0;
      uppercopy((char *)lumps,(char *)file);
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[0].Name._0_4_ = (undefined4)lVar3;
      lumps[0].Name._4_4_ = WriteTHINGS((FILE *)header._4_8_);
      lumps[1].FilePos = 0x4e494854;
      lumps[1].Size._0_2_ = 0x5347;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[1].Name._0_4_ = (undefined4)lVar3;
      lumps[1].Name._4_4_ = WriteLINEDEFS((FILE *)header._4_8_);
      lumps[2]._0_8_ = 0x53464544454e494c;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[2].Name._0_4_ = (undefined4)lVar3;
      lumps[2].Name._4_4_ = WriteSIDEDEFS((FILE *)header._4_8_);
      lumps[3]._0_8_ = 0x5346454445444953;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[3].Name._0_4_ = (undefined4)lVar3;
      lumps[3].Name._4_4_ = WriteVERTEXES((FILE *)header._4_8_);
      lumps[4]._0_8_ = 0x5345584554524556;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[4].Name._0_4_ = (undefined4)lVar3;
      lumps[4].Name._4_4_ = WriteSEGS((FILE *)header._4_8_);
      lumps[5].FilePos = 0x53474553;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[5].Name._0_4_ = (undefined4)lVar3;
      lumps[5].Name._4_4_ = WriteSSECTORS((FILE *)header._4_8_);
      lumps[6]._0_8_ = 0x53524f5443455353;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[6].Name._0_4_ = (undefined4)lVar3;
      lumps[6].Name._4_4_ = WriteNODES((FILE *)header._4_8_);
      lumps[7].FilePos = 0x45444f4e;
      lumps[7].Size._0_1_ = 0x53;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[7].Name._0_4_ = (undefined4)lVar3;
      lumps[7].Name._4_4_ = WriteSECTORS((FILE *)header._4_8_);
      lumps[8].FilePos = 0x54434553;
      lumps[8].Size._0_2_ = 0x524f;
      lumps[8].Size._2_1_ = 0x53;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[8].Name._0_4_ = (undefined4)lVar3;
      lumps[8].Name._4_4_ = WriteREJECT((FILE *)header._4_8_);
      lumps[9].FilePos = 0x454a4552;
      lumps[9].Size._0_2_ = 0x5443;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[9].Name._0_4_ = (undefined4)lVar3;
      lumps[9].Name._4_4_ = WriteBLOCKMAP((FILE *)header._4_8_);
      lumps[10]._0_8_ = 0x50414d4b434f4c42;
      lVar3 = ftell((FILE *)header._4_8_);
      lumps[10].Name._0_4_ = (undefined4)lVar3;
      lumps[10].Name._4_4_ = WriteBEHAVIOR((FILE *)header._4_8_);
      lumps[0xb]._0_8_ = 0x524f495641484542;
      lVar3 = ftell((FILE *)header._4_8_);
      header.Magic = (DWORD)lVar3;
      fwrite(&local_108,0x10,0xc,(FILE *)header._4_8_);
      fseek((FILE *)header._4_8_,0,0);
      fwrite(&local_3c,0xc,1,(FILE *)header._4_8_);
      fclose((FILE *)header._4_8_);
    }
  }
  else {
    Printf("You can only dump a map when inside a level.\n");
  }
  return;
}

Assistant:

CCMD (dumpmap)
{
	const char *mapname;
	FILE *file;

	if (argv.argc() < 2)
	{
		Printf ("Usage: dumpmap <wadname> [mapname]\n");
		return;
	}
	
	if (gamestate != GS_LEVEL)
	{
		Printf ("You can only dump a map when inside a level.\n");
		return;
	}

	if (argv.argc() < 3)
	{
		if (gameinfo.flags & GI_MAPxx)
		{
			mapname = "MAP01";
		}
		else
		{
			mapname = "E1M1";
		}
	}
	else
	{
		mapname = argv[2];
	}

	file = fopen (argv[1], "wb");
	if (file == NULL)
	{
		Printf ("Cannot write %s\n", argv[1]);
		return;
	}

	wadinfo_t header = { PWAD_ID, 12, 0 };
	wadlump_t lumps[12] = { {0, 0, {0}} };

	fseek (file, 12, SEEK_SET);
	
	lumps[0].FilePos = LittleLong(12);
	lumps[0].Size = 0;
	uppercopy (lumps[0].Name, mapname);

	APPEND(1, THINGS);
	APPEND(2, LINEDEFS);
	APPEND(3, SIDEDEFS);
	APPEND(4, VERTEXES);
	APPEND(5, SEGS);
	APPEND(6, SSECTORS);
	APPEND(7, NODES);
	APPEND(8, SECTORS);
	APPEND(9, REJECT);
	APPEND(10, BLOCKMAP);
	APPEND(11, BEHAVIOR);

	header.InfoTableOfs = ftell (file);

	fwrite (lumps, 16, 12, file);
	fseek (file, 0, SEEK_SET);
	fwrite (&header, 12, 1, file);

	fclose (file);
}